

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::setAllOnes(SVInt *this)

{
  bool bVar1;
  int iVar2;
  uint64_t *puVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((this->super_SVIntStorage).unknownFlag == true) {
    (this->super_SVIntStorage).unknownFlag = false;
    puVar3 = (this->super_SVIntStorage).field_0.pVal;
    if (puVar3 != (uint64_t *)0x0) {
      operator_delete__(puVar3);
    }
    uVar5 = ((this->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
            ((this->super_SVIntStorage).unknownFlag & 0x1fU);
    if (1 < uVar5) {
      puVar3 = (uint64_t *)operator_new__((ulong)(uVar5 << 3));
      (this->super_SVIntStorage).field_0.pVal = puVar3;
    }
  }
  uVar5 = (this->super_SVIntStorage).bitWidth;
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (uVar5 < 0x41 && (bVar1 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val = 0xffffffffffffffff;
  }
  else {
    uVar5 = uVar5 + 0x3f;
    if (0x3f < uVar5) {
      iVar2 = (uVar5 >> 6) << (bVar1 & 0x1fU);
      uVar4 = 0;
      do {
        (this->super_SVIntStorage).field_0.pVal[uVar4] = 0xffffffffffffffff;
        uVar4 = uVar4 + 1;
      } while (iVar2 + (uint)(iVar2 == 0) != uVar4);
    }
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllOnes() {
    // we don't have unknown digits anymore, so reallocate if necessary
    if (unknownFlag) {
        unknownFlag = false;
        delete[] pVal;
        if (getNumWords() > 1)
            pVal = new uint64_t[getNumWords()];
    }

    if (isSingleWord())
        val = UINT64_MAX;
    else {
        for (uint32_t i = 0; i < getNumWords(); i++)
            pVal[i] = UINT64_MAX;
    }
    clearUnusedBits();
}